

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areadump.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ImageStructureHeader IVar6;
  NOAALRITHeader NVar7;
  Area AVar8;
  Area tmp;
  NOAALRITHeader nl;
  ImageNavigationHeader in;
  ImageStructureHeader is;
  File *file_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<lrit::File,_std::allocator<lrit::File>_> *__range2_1;
  Area area;
  SegmentIdentificationHeader si;
  vector<lrit::File,_std::allocator<lrit::File>_> *files_1;
  pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_> *it;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  *__range1;
  mapped_type *files;
  SegmentIdentificationHeader sih;
  File file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Dir dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  int rv;
  stat st;
  int i;
  map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  all;
  value_type *in_stack_fffffffffffffbc8;
  File *in_stack_fffffffffffffbd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd8;
  File *in_stack_fffffffffffffbe0;
  key_type *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  string *in_stack_fffffffffffffc18;
  Dir *in_stack_fffffffffffffc20;
  Area local_398;
  undefined8 local_388;
  string *in_stack_fffffffffffffc80;
  Dir *in_stack_fffffffffffffc88;
  int local_348;
  int local_344;
  ushort uStack_32a;
  __normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_> local_310;
  vector<lrit::File,_std::allocator<lrit::File>_> *local_308;
  Area local_2fc;
  ushort local_2e0;
  File *local_2d8;
  File *local_2d0;
  vector<lrit::File,_std::allocator<lrit::File>_> *local_2c8;
  reference local_2c0;
  _Self local_2b8;
  _Self local_2b0;
  undefined1 *local_2a8;
  uint local_29c;
  Dir *local_298;
  ushort local_28a;
  undefined4 local_27c;
  reference local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  undefined1 *local_1c8;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [63];
  allocator local_151;
  string local_150 [72];
  undefined1 local_108 [44];
  int local_dc;
  string *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  __uid_t in_stack_ffffffffffffff44;
  int local_44;
  undefined1 local_40 [48];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::
  map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  ::map((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
         *)0x11992e);
  local_44 = 1;
  while( true ) {
    if (local_8 <= local_44) {
      local_2a8 = local_40;
      local_2b0._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
           ::begin((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                    *)in_stack_fffffffffffffbc8);
      local_2b8._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
           ::end((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                  *)in_stack_fffffffffffffbc8);
      while( true ) {
        bVar2 = std::operator!=(&local_2b0,&local_2b8);
        if (!bVar2) break;
        local_2c0 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>
                                 *)0x119e79);
        local_2c8 = &local_2c0->second;
        local_2d0 = (File *)std::vector<lrit::File,_std::allocator<lrit::File>_>::begin
                                      ((vector<lrit::File,_std::allocator<lrit::File>_> *)
                                       in_stack_fffffffffffffbc8);
        local_2d8 = (File *)std::vector<lrit::File,_std::allocator<lrit::File>_>::end
                                      ((vector<lrit::File,_std::allocator<lrit::File>_> *)
                                       in_stack_fffffffffffffbc8);
        std::
        sort<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,main::__0>
                  (local_2d0,local_2d8);
        std::vector<lrit::File,_std::allocator<lrit::File>_>::operator[](local_2c8,0);
        lrit::File::getHeader<lrit::SegmentIdentificationHeader>(in_stack_fffffffffffffbd0);
        sVar4 = std::vector<lrit::File,_std::allocator<lrit::File>_>::size(local_2c8);
        if (sVar4 == local_2e0) {
          Area::Area(&local_2fc);
          local_308 = local_2c8;
          local_310._M_current =
               (File *)std::vector<lrit::File,_std::allocator<lrit::File>_>::begin
                                 ((vector<lrit::File,_std::allocator<lrit::File>_> *)
                                  in_stack_fffffffffffffbc8);
          std::vector<lrit::File,_std::allocator<lrit::File>_>::end
                    ((vector<lrit::File,_std::allocator<lrit::File>_> *)in_stack_fffffffffffffbc8);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>
                                *)in_stack_fffffffffffffbd0,
                               (__normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>
                                *)in_stack_fffffffffffffbc8);
            if (!bVar2) break;
            __gnu_cxx::
            __normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>::
            operator*(&local_310);
            IVar6 = lrit::File::getHeader<lrit::ImageStructureHeader>(in_stack_fffffffffffffbe0);
            lrit::File::getHeader<lrit::ImageNavigationHeader>(in_stack_fffffffffffffbc8);
            NVar7 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x11a004);
            local_388 = NVar7._0_8_;
            Area::Area(&local_398);
            local_398.minColumn = -local_348;
            uStack_32a = IVar6.columns;
            local_398.maxColumn = (uint)uStack_32a - local_348;
            local_398.maxLine = (IVar6._8_4_ & 0xffff) - local_344;
            if (NVar7.productID == 0x2b) {
              local_398.maxLine = (IVar6._8_4_ & 0xffff) - local_344;
            }
            local_398.minLine = -local_344;
            iVar3 = Area::height(&local_2fc);
            if (iVar3 == 0) {
              AVar8.maxColumn = local_398.maxColumn;
              AVar8.minColumn = local_398.minColumn;
              AVar8.maxLine = local_398.maxLine;
              AVar8.minLine = local_398.minLine;
            }
            else {
              AVar8 = Area::getUnion((Area *)in_stack_fffffffffffffbd0,
                                     (Area *)in_stack_fffffffffffffbc8);
            }
            local_2fc = AVar8;
            lrit::ImageNavigationHeader::~ImageNavigationHeader((ImageNavigationHeader *)0x11a190);
            __gnu_cxx::
            __normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>::
            operator++(&local_310);
          }
          std::operator<<((ostream *)&std::cout,"crop = [ ");
          in_stack_fffffffffffffbe0 =
               (File *)std::ostream::operator<<(&std::cout,local_2fc.minColumn);
          std::operator<<((ostream *)in_stack_fffffffffffffbe0,", ");
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,local_2fc.maxColumn);
          std::operator<<(poVar5,", ");
          in_stack_fffffffffffffbd0 = (File *)std::ostream::operator<<(&std::cout,local_2fc.minLine)
          ;
          std::operator<<((ostream *)in_stack_fffffffffffffbd0,", ");
          in_stack_fffffffffffffbc8 =
               (value_type *)std::ostream::operator<<(&std::cout,local_2fc.maxLine);
          std::operator<<((ostream *)in_stack_fffffffffffffbc8," ]");
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>
                      *)in_stack_fffffffffffffbd0);
      }
      std::
      map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
      ::~map((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
              *)0x11a29f);
      return local_4;
    }
    local_dc = stat(*(char **)(local_10 + (long)local_44 * 8),(stat *)&stack0xffffffffffffff28);
    if (local_dc < 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1199bd);
    if ((in_stack_ffffffffffffff40 & 0xf000) == 0x4000) {
      pcVar1 = *(char **)(local_10 + (long)local_44 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar1,&local_151);
      Dir::Dir(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"*.lrit*",&local_191);
      Dir::matchFiles(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbe0);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      Dir::~Dir((Dir *)in_stack_fffffffffffffbd0);
    }
    else {
      pcVar1 = *(char **)(local_10 + (long)local_44 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,pcVar1,&local_1b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->file_);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    }
    local_1c8 = local_108;
    local_1d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffbc8);
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbc8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffbd0,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffbc8), bVar2) {
      local_1e0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1d0);
      lrit::File::File((File *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
      bVar2 = lrit::File::hasHeader<lrit::ImageNavigationHeader>((File *)0x119cdf);
      if (bVar2) {
        lrit::File::getHeader<lrit::SegmentIdentificationHeader>(in_stack_fffffffffffffbd0);
        local_29c = (uint)local_28a;
        in_stack_fffffffffffffc20 =
             (Dir *)std::
                    map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                    ::operator[]((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                 in_stack_fffffffffffffc08);
        local_298 = in_stack_fffffffffffffc20;
        std::vector<lrit::File,_std::allocator<lrit::File>_>::push_back
                  ((vector<lrit::File,_std::allocator<lrit::File>_> *)in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8);
        local_27c = 0;
      }
      else {
        local_27c = 6;
      }
      lrit::File::~File(in_stack_fffffffffffffbd0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbe0);
    local_44 = local_44 + 1;
  }
  perror("stat");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  std::map<int, std::vector<lrit::File>> all;

  // Group files by their image identifier
  for (int i = 1; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      perror("stat");
      exit(1);
    }

    std::vector<std::string> result;
    if (S_ISDIR(st.st_mode)) {
      Dir dir(argv[i]);
      result = dir.matchFiles("*.lrit*");
    } else {
      result.push_back(argv[i]);
    }

    for (const auto& path : result) {
      auto file = lrit::File(path);
      if (!file.hasHeader<lrit::ImageNavigationHeader>()) {
        continue;
      }

      auto sih = file.getHeader<lrit::SegmentIdentificationHeader>();
      auto& files = all[sih.imageIdentifier];
      files.push_back(std::move(file));
    }
  }

  // Compute area for all images
  for (auto& it : all) {
    auto& files = it.second;

    // Sort by segment identifier
    std::sort(
      files.begin(),
      files.end(),
      [](const auto& a, const auto& b) -> bool {
        auto sa = a.template getHeader<lrit::SegmentIdentificationHeader>();
        auto sb = b.template getHeader<lrit::SegmentIdentificationHeader>();
        return sa.segmentNumber < sb.segmentNumber;
      });

    // Ignore incomplete images
    auto si = files[0].getHeader<lrit::SegmentIdentificationHeader>();
    if (files.size() != si.maxSegment) {
      continue;
    }

    // Compute area covered by this segmented image.
    // Largely copied from the original version of goesproc,
    // which was removed in eaa56cb2.
    Area area;
    for (auto& file : files) {
      auto is = file.getHeader<lrit::ImageStructureHeader>();
      auto in = file.getHeader<lrit::ImageNavigationHeader>();
      auto nl = file.getHeader<lrit::NOAALRITHeader>();

      // Update relative area represented by this image
      Area tmp;
      tmp.minColumn = -in.columnOffset;
      tmp.maxColumn = -in.columnOffset + is.columns;
      tmp.minLine = -in.lineOffset;
      tmp.maxLine = -in.lineOffset + is.lines;

      // For Himawari-8, the line offset is an int32_t and can be negative
      if (nl.productID == 43) {
        tmp.minLine = -(int32_t)in.lineOffset;
        tmp.maxLine = -(int32_t)in.lineOffset + is.lines;
      }

      if (area.height() == 0) {
        area = tmp;
      } else {
        area = area.getUnion(tmp);
      }
    }

    std::cout << "crop = [ ";
    std::cout << area.minColumn << ", ";
    std::cout << area.maxColumn << ", ";
    std::cout << area.minLine << ", ";
    std::cout << area.maxLine << " ]";
    std::cout << std::endl;
  }
}